

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_xbm.c
# Opt level: O2

gdImagePtr gdImageCreateFromXbm(FILE *fd)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  gdImagePtr im;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int local_25c;
  char h [8];
  uint b;
  int value;
  char fline [255];
  char iname [255];
  
  rewind((FILE *)fd);
  iVar11 = 0;
  iVar6 = 0;
  iVar7 = 0;
  iVar9 = 0;
  do {
    iVar10 = ((uint)(iVar9 * iVar11) >> 3) + 1;
    iVar1 = iVar6;
LAB_00123216:
    iVar6 = iVar1;
    pcVar3 = fgets(fline,0xff,(FILE *)fd);
    if (pcVar3 == (char *)0x0) goto LAB_00123379;
    fline[0xfe] = '\0';
    sVar4 = strlen(fline);
    if (sVar4 == 0xfe) {
      return (gdImagePtr)0x0;
    }
    iVar1 = __isoc99_sscanf(fline,"#define %s %d",iname,&value);
    if (iVar1 != 2) {
      iVar1 = __isoc99_sscanf(fline,"static unsigned char %s = {",iname);
      iVar2 = 0x80;
      if ((iVar1 != 1) && (iVar1 = __isoc99_sscanf(fline,"static char %s = {",iname), iVar1 != 1))
      break;
      goto LAB_001232ed;
    }
    pcVar5 = strrchr(iname,0x5f);
    pcVar3 = pcVar5 + 1;
    if (pcVar5 == (char *)0x0) {
      pcVar3 = iname;
    }
    iVar10 = strcmp("width",pcVar3);
    iVar1 = value;
    if (iVar10 == 0) {
      iVar11 = value;
    }
    iVar10 = strcmp("height",pcVar3);
    if (iVar10 == 0) {
      iVar9 = iVar1;
    }
  } while( true );
  iVar1 = __isoc99_sscanf(fline,"static unsigned short %s = {",iname);
  iVar2 = 0x8000;
  if ((iVar1 == 1) ||
     ((iVar1 = __isoc99_sscanf(fline,"static short %s = {",iname), iVar1 == 1 ||
      (iVar1 = 0, iVar2 = iVar6, iVar6 != 0)))) {
LAB_001232ed:
    iVar6 = iVar2;
    pcVar5 = strrchr(iname,0x5f);
    pcVar3 = pcVar5 + 1;
    if (pcVar5 == (char *)0x0) {
      pcVar3 = iname;
    }
    iVar2 = strcmp("bits[]",pcVar3);
    iVar7 = iVar10;
    iVar1 = iVar6;
    if (iVar2 == 0) {
LAB_00123379:
      if (iVar6 == 0 || iVar7 == 0) {
        return (gdImagePtr)0x0;
      }
      im = gdImageCreate(iVar11,iVar9);
      if (im == (gdImagePtr)0x0) {
        return (gdImagePtr)0x0;
      }
      gdImageColorAllocate(im,0xff,0xff,0xff);
      gdImageColorAllocate(im,0,0,0);
      h[2] = '\0';
      h[4] = '\0';
      iVar11 = 0;
      iVar9 = 0;
      local_25c = 0;
      goto LAB_001233ea;
    }
  }
  goto LAB_00123216;
LAB_001233ea:
  if (iVar11 == iVar7) {
LAB_001234ed:
    gd_error("EOF before image was complete");
    gdImageDestroy(im);
    return (gdImagePtr)0x0;
  }
  do {
    iVar1 = getc((FILE *)fd);
    if (iVar1 == -1) goto LAB_001234ed;
  } while (iVar1 != 0x78);
  iVar1 = getc((FILE *)fd);
  if (iVar1 == -1) goto LAB_001234ed;
  h[0] = (char)iVar1;
  iVar1 = getc((FILE *)fd);
  if (iVar1 == -1) goto LAB_001234ed;
  h[1] = (char)iVar1;
  if (iVar6 == 0x8000) {
    iVar1 = getc((FILE *)fd);
    if (iVar1 == -1) goto LAB_001234ed;
    h[2] = (char)iVar1;
    iVar1 = getc((FILE *)fd);
    if (iVar1 == -1) goto LAB_001234ed;
    h[3] = (char)iVar1;
  }
  __isoc99_sscanf(h,"%x",&b);
  uVar8 = 1;
  do {
    if (iVar6 < (int)uVar8) goto LAB_001234dc;
    iVar1 = iVar9 + 1;
    gdImageSetPixel(im,iVar9,local_25c,(uint)((b & uVar8) != 0));
    uVar8 = uVar8 * 2;
    iVar9 = iVar1;
  } while (iVar1 != im->sx);
  local_25c = local_25c + 1;
  iVar9 = 0;
  if (local_25c == im->sy) {
    return im;
  }
LAB_001234dc:
  iVar11 = iVar11 + 1;
  goto LAB_001233ea;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromXbm(FILE * fd)
{
	char fline[MAX_XBM_LINE_SIZE];
	char iname[MAX_XBM_LINE_SIZE];
	char *type;
	int value;
	unsigned int width = 0, height = 0;
	int fail = 0;
	int max_bit = 0;

	gdImagePtr im;
	int bytes = 0, i;
	int bit, x = 0, y = 0;
	int ch;
	char h[8];
	unsigned int b;

	rewind(fd);
	while (fgets(fline, MAX_XBM_LINE_SIZE, fd)) {
		fline[MAX_XBM_LINE_SIZE-1] = '\0';
		if (strlen(fline) == MAX_XBM_LINE_SIZE-1) {
			return 0;
		}
		if (sscanf(fline, "#define %s %d", iname, &value) == 2) {
			if (!(type = strrchr(iname, '_'))) {
				type = iname;
			} else {
				type++;
			}

			if (!strcmp("width", type)) {
				width = (unsigned int) value;
			}
			if (!strcmp("height", type)) {
				height = (unsigned int) value;
			}
		} else {
			if ( sscanf(fline, "static unsigned char %s = {", iname) == 1
			  || sscanf(fline, "static char %s = {", iname) == 1)
			{
				max_bit = 128;
			} else if (sscanf(fline, "static unsigned short %s = {", iname) == 1
					|| sscanf(fline, "static short %s = {", iname) == 1)
			{
				max_bit = 32768;
			}
			if (max_bit) {
				bytes = (width * height / 8) + 1;
				if (!bytes) {
					return 0;
				}
				if (!(type = strrchr(iname, '_'))) {
					type = iname;
				} else {
					type++;
				}
				if (!strcmp("bits[]", type)) {
					break;
				}
			}
 		}
	}
	if (!bytes || !max_bit) {
		return 0;
	}

	if(!(im = gdImageCreate(width, height))) {
		return 0;
	}
	gdImageColorAllocate(im, 255, 255, 255);
	gdImageColorAllocate(im, 0, 0, 0);
	h[2] = '\0';
	h[4] = '\0';
	for (i = 0; i < bytes; i++) {
		while (1) {
			if ((ch=getc(fd)) == EOF) {
				fail = 1;
				break;
			}
			if (ch == 'x') {
				break;
			}
		}
		if (fail) {
			break;
		}
		/* Get hex value */
		if ((ch=getc(fd)) == EOF) {
			break;
		}
		h[0] = ch;
		if ((ch=getc(fd)) == EOF) {
			break;
		}
		h[1] = ch;
		if (max_bit == 32768) {
			if ((ch=getc(fd)) == EOF) {
				break;
			}
			h[2] = ch;
			if ((ch=getc(fd)) == EOF) {
				break;
			}
			h[3] = ch;
		}
		sscanf(h, "%x", &b);
		for (bit = 1; bit <= max_bit; bit = bit << 1) {
			gdImageSetPixel(im, x++, y, (b & bit) ? 1 : 0);
			if (x == im->sx) {
				x = 0;
				y++;
				if (y == im->sy) {
					return im;
				}
				break;
			}
		}
	}

	gd_error("EOF before image was complete");
	gdImageDestroy(im);
	return 0;
}